

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_lu.cc
# Opt level: O3

int X509_STORE_CTX_get_by_subject(X509_STORE_CTX *vs,int type,X509_NAME *name,X509_OBJECT *ret)

{
  X509_STORE *pXVar1;
  OPENSSL_STACK *sk;
  code *pcVar2;
  int iVar3;
  int *piVar4;
  size_t sVar5;
  long *plVar6;
  size_t sVar7;
  int *piVar8;
  X509_OBJECT stmp;
  int local_40 [4];
  
  pXVar1 = vs->ctx;
  CRYPTO_MUTEX_lock_write(&pXVar1->objs_lock);
  sk = (OPENSSL_STACK *)pXVar1->objs;
  piVar4 = (int *)0x0;
  iVar3 = x509_object_idx_cnt((stack_st_X509_OBJECT *)sk,type,name,(int *)0x0);
  if (iVar3 != -1) {
    piVar4 = (int *)OPENSSL_sk_value(sk,(long)iVar3);
  }
  CRYPTO_MUTEX_unlock_write(&pXVar1->objs_lock);
  piVar8 = piVar4;
  if (type == 2 || piVar4 == (int *)0x0) {
    sVar5 = OPENSSL_sk_num((OPENSSL_STACK *)pXVar1->get_cert_methods);
    if (sVar5 != 0) {
      sVar5 = 0;
      piVar8 = local_40;
      do {
        plVar6 = (long *)OPENSSL_sk_value((OPENSSL_STACK *)pXVar1->get_cert_methods,sVar5);
        if (((*plVar6 != 0) && (pcVar2 = *(code **)(*plVar6 + 0x18), pcVar2 != (code *)0x0)) &&
           (iVar3 = (*pcVar2)(plVar6,type,name,piVar8), 0 < iVar3)) goto LAB_001ab08c;
        sVar5 = sVar5 + 1;
        sVar7 = OPENSSL_sk_num((OPENSSL_STACK *)pXVar1->get_cert_methods);
      } while (sVar5 < sVar7);
    }
    piVar8 = piVar4;
    if (piVar4 == (int *)0x0) {
      return 0;
    }
  }
LAB_001ab08c:
  ret->type = *piVar8;
  ret->data = *(anon_union_8_4_ca12f507_for_data *)(piVar8 + 2);
  X509_OBJECT_up_ref_count((X509_OBJECT *)ret);
  return 1;
}

Assistant:

int X509_STORE_CTX_get_by_subject(X509_STORE_CTX *vs, int type, X509_NAME *name,
                                  X509_OBJECT *ret) {
  X509_STORE *ctx = vs->ctx;
  X509_OBJECT stmp;
  CRYPTO_MUTEX_lock_write(&ctx->objs_lock);
  X509_OBJECT *tmp = X509_OBJECT_retrieve_by_subject(ctx->objs, type, name);
  CRYPTO_MUTEX_unlock_write(&ctx->objs_lock);

  if (tmp == NULL || type == X509_LU_CRL) {
    for (size_t i = 0; i < sk_X509_LOOKUP_num(ctx->get_cert_methods); i++) {
      X509_LOOKUP *lu = sk_X509_LOOKUP_value(ctx->get_cert_methods, i);
      if (X509_LOOKUP_by_subject(lu, type, name, &stmp)) {
        tmp = &stmp;
        break;
      }
    }
    if (tmp == NULL) {
      return 0;
    }
  }

  // TODO(crbug.com/boringssl/685): This should call
  // |X509_OBJECT_free_contents|.
  ret->type = tmp->type;
  ret->data = tmp->data;
  X509_OBJECT_up_ref_count(ret);
  return 1;
}